

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  ostream *poVar1;
  ostream *out;
  ostream *this_00;
  ostream *in_RSI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int64_t eta;
  double lr;
  double wst;
  tuple<long,_double,_double> *in_stack_ffffffffffffff38;
  tuple<double_&,_double_&,_long_&> *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  ClockPrint local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  real in_stack_ffffffffffffffa4;
  FastText *in_stack_ffffffffffffffa8;
  int32_t local_30;
  double local_28;
  double local_20;
  
  progressInfo(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::tie<double,double,long>
            (in_stack_ffffffffffffff48,(double *)in_stack_ffffffffffffff40,
             (long *)in_stack_ffffffffffffff38);
  std::tuple<double&,double&,long&>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::ostream::operator<<(in_RSI,std::fixed);
  std::operator<<(in_RSI,"Progress: ");
  poVar1 = in_RSI;
  local_64 = (int)std::setprecision(1);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_64);
  local_68 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_68);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da * 100.0);
  std::operator<<(poVar1,"%");
  poVar1 = std::operator<<(in_RSI," words/sec/thread: ");
  local_6c = (int)std::setw(7);
  poVar1 = std::operator<<(poVar1,(_Setw)local_6c);
  std::ostream::operator<<(poVar1,(long)local_20);
  poVar1 = std::operator<<(in_RSI," lr: ");
  local_70 = (int)std::setw(9);
  poVar1 = std::operator<<(poVar1,(_Setw)local_70);
  local_74 = (int)std::setprecision(6);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_74);
  std::ostream::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(in_RSI," avg.loss: ");
  local_78 = (int)std::setw(9);
  out = std::operator<<(poVar1,(_Setw)local_78);
  local_7c = (int)std::setprecision(6);
  this_00 = std::operator<<(out,(_Setprecision)local_7c);
  std::ostream::operator<<(this_00,in_XMM1_Da);
  std::operator<<(in_RSI," ETA: ");
  utils::ClockPrint::ClockPrint(&local_80,local_30);
  utils::operator<<(out,(ClockPrint *)poVar1);
  std::ostream::operator<<(in_RSI,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  double wst;
  double lr;
  int64_t eta;
  std::tie<double, double, int64_t>(wst, lr, eta) = progressInfo(progress);

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << (progress * 100) << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " avg.loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << utils::ClockPrint(eta);
  log_stream << std::flush;
}